

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chibicc_parse.c
# Opt level: O3

C_Type * typeof_specifier(C_Parser *parser,C_Token **rest,C_Token *tok)

{
  _Bool _Var1;
  C_Token *pCVar2;
  C_Type *pCVar3;
  C_Node *node;
  C_Token *local_30;
  C_Token *local_28;
  
  pCVar2 = C_skip(parser,tok,"(");
  local_30 = pCVar2;
  _Var1 = is_typename(parser,pCVar2);
  if (_Var1) {
    local_28 = pCVar2;
    pCVar3 = declspec(parser,&local_28,pCVar2,(VarAttr *)0x0);
    pCVar3 = abstract_declarator(parser,&local_30,local_28,pCVar3);
  }
  else {
    node = expr(parser,&local_30,pCVar2);
    C_add_type(parser,node);
    pCVar3 = node->ty;
  }
  pCVar2 = C_skip(parser,local_30,")");
  *rest = pCVar2;
  return pCVar3;
}

Assistant:

static C_Type *typeof_specifier(C_Parser *parser, C_Token **rest, C_Token *tok) {
  tok = C_skip(parser, tok, "(");

  C_Type *ty;
  if (is_typename(parser, tok)) {
    ty = typename(parser, &tok, tok);
  } else {
    C_Node *node = expr(parser, &tok, tok);
    C_add_type(parser, node);
    ty = node->ty;
  }
  *rest = C_skip(parser, tok, ")");
  return ty;
}